

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boolean_column_reader.hpp
# Opt level: O3

bool duckdb::BooleanParquetValueConversion::PlainRead<true>
               (ByteBuffer *plain_data,ColumnReader *reader)

{
  byte bVar1;
  byte bVar2;
  BooleanColumnReader *pBVar3;
  uint8_t uVar4;
  
  pBVar3 = ColumnReader::Cast<duckdb::BooleanColumnReader>(reader);
  bVar1 = *plain_data->ptr;
  bVar2 = pBVar3->byte_pos;
  uVar4 = bVar2 + 1;
  pBVar3->byte_pos = uVar4;
  if (uVar4 == '\b') {
    pBVar3->byte_pos = '\0';
    ByteBuffer::available(plain_data,1);
    plain_data->len = plain_data->len - 1;
    plain_data->ptr = plain_data->ptr + 1;
  }
  return (bVar1 >> (bVar2 & 0x1f) & 1) != 0;
}

Assistant:

static bool PlainRead(ByteBuffer &plain_data, ColumnReader &reader) {
		auto &byte_pos = reader.Cast<BooleanColumnReader>().byte_pos;
		bool ret = (*plain_data.ptr >> byte_pos) & 1;
		if (++byte_pos == 8) {
			byte_pos = 0;
			if (CHECKED) {
				plain_data.inc(1);
			} else {
				plain_data.unsafe_inc(1);
			}
		}
		return ret;
	}